

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpinfo.c
# Opt level: O3

WebPInfoStatus
ParseLossyFilterHeader(WebPInfo *webp_info,uint8_t *data,size_t data_size,uint64_t *bit_pos)

{
  uint8_t uVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  uint64_t uVar6;
  ulong uVar7;
  uint64_t uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  char local_34;
  
  uVar10 = *bit_pos;
  *bit_pos = uVar10 + 1;
  if (uVar10 >> 3 < data_size) {
    uVar1 = data[uVar10 >> 3];
    iVar3 = (int)uVar10 + 1;
    uVar6 = uVar10 + 2;
    uVar12 = 0;
    lVar11 = -6;
    do {
      *bit_pos = uVar6;
      uVar4 = uVar6 - 1 >> 3;
      if (data_size <= uVar4) goto LAB_00104da1;
      uVar12 = (uint)((byte)(data[uVar4] << ((byte)iVar3 & 7)) >> 7) + uVar12 * 2;
      iVar3 = iVar3 + 1;
      uVar6 = uVar6 + 1;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0);
    uVar9 = 0;
    lVar11 = -3;
    do {
      uVar7 = uVar6;
      *bit_pos = uVar7;
      uVar4 = uVar7 - 1 >> 3;
      if (data_size <= uVar4) goto LAB_00104da1;
      uVar9 = (uint)((byte)(data[uVar4] << ((byte)iVar3 & 7)) >> 7) + uVar9 * 2;
      iVar3 = iVar3 + 1;
      lVar11 = lVar11 + 1;
      uVar6 = uVar7 + 1;
    } while (lVar11 != 0);
    *bit_pos = uVar7 + 1;
    if (uVar7 >> 3 < data_size) {
      uVar5 = (uint)data[uVar7 >> 3] << ((byte)iVar3 & 7);
      printf("  Simple filter:    %d\n",(ulong)((byte)(uVar1 << ((byte)uVar10 & 7)) >> 7));
      printf("  Level:            %d\n",(ulong)uVar12);
      printf("  Sharpness:        %d\n",(ulong)uVar9);
      printf("  Use lf delta:     %d\n",(ulong)(uVar5 >> 7 & 1));
      local_34 = (char)uVar5;
      if (-1 < local_34) {
        return WEBP_INFO_OK;
      }
      uVar10 = *bit_pos;
      *bit_pos = uVar10 + 1;
      if (uVar10 >> 3 < data_size) {
        bVar2 = data[uVar10 >> 3] << ((byte)uVar10 & 7);
        printf("  Update lf delta:  %d\n",(ulong)(bVar2 >> 7));
        if (-1 < (char)bVar2) {
          return WEBP_INFO_OK;
        }
        uVar6 = *bit_pos;
        iVar3 = 0;
        while( true ) {
          uVar8 = uVar6 + 1;
          *bit_pos = uVar8;
          uVar10 = uVar6 >> 3;
          if (data_size <= uVar10) break;
          bVar2 = (byte)uVar6;
          uVar6 = uVar8;
          if ((char)(data[uVar10] << (bVar2 & 7)) < '\0') {
            lVar11 = -7;
            do {
              uVar6 = uVar8 + 1;
              if (data_size <= uVar8 >> 3) {
                *bit_pos = uVar6;
                goto LAB_00104da1;
              }
              lVar11 = lVar11 + 1;
              uVar8 = uVar6;
            } while (lVar11 != 0);
            *bit_pos = uVar6;
          }
          iVar3 = iVar3 + 1;
          if (iVar3 == 8) {
            return WEBP_INFO_OK;
          }
        }
      }
      iVar3 = webp_info->show_diagnosis;
      goto joined_r0x00104d90;
    }
  }
LAB_00104da1:
  iVar3 = webp_info->show_diagnosis;
joined_r0x00104d90:
  if (iVar3 != 0) {
    ParseLossyFilterHeader_cold_1();
  }
  return WEBP_INFO_TRUNCATED_DATA;
}

Assistant:

static WebPInfoStatus ParseLossyFilterHeader(const WebPInfo* const webp_info,
                                             const uint8_t* const data,
                                             size_t data_size,
                                             uint64_t* const bit_pos) {
  int simple_filter, level, sharpness, use_lf_delta;
  GET_BITS(simple_filter, 1);
  GET_BITS(level, 6);
  GET_BITS(sharpness, 3);
  GET_BITS(use_lf_delta, 1);
  printf("  Simple filter:    %d\n", simple_filter);
  printf("  Level:            %d\n", level);
  printf("  Sharpness:        %d\n", sharpness);
  printf("  Use lf delta:     %d\n", use_lf_delta);
  if (use_lf_delta) {
    int update;
    GET_BITS(update, 1);
    printf("  Update lf delta:  %d\n", update);
    if (update) {
      int i;
      for (i = 0; i < 4 + 4; ++i) {
        int temp;
        GET_BITS(temp, 1);
        if (temp) GET_BITS(temp, 7);
      }
    }
  }
  return WEBP_INFO_OK;
}